

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O1

void dill_begin_prefix_code(dill_stream s)

{
  void *pvVar1;
  
  if (s->j->proc_start == virtual_proc_start) {
    pvVar1 = s->p->mach_info;
    virtual_reti(s,4,0,0);
    *(int *)((long)pvVar1 + 0x18) =
         (int)((ulong)(long)(*(int *)&s->p->cur_ip - *(int *)&s->p->code_base) / 0x28);
    return;
  }
  __assert_fail("s->j->proc_start == (dill_mach_proc_start)virtual_proc_start",
                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/dill/dill/virtual.c"
                ,0x1128,"void dill_begin_prefix_code(dill_stream)");
}

Assistant:

extern void
dill_begin_prefix_code(dill_stream s)
{
    virtual_mach_info vmi = (virtual_mach_info)s->p->mach_info;
    /* have to be in virtual mode */
    assert(s->j->proc_start == (dill_mach_proc_start)virtual_proc_start);
    /* insert a return, so we don't fall into prefix code */
    virtual_reti(s, DILL_I, 0, 0);
    vmi->prefix_code_start =
        (int)(s->p->cur_ip - s->p->code_base) / sizeof(virtual_insn);
}